

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::Resize
          (TPZManVector<TPZEqnArray<double>,_10> *this,int64_t newsize)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  TPZEqnArray<double> *pTVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZEqnArray<double> *pTVar7;
  long in_RSI;
  TPZManVector<TPZEqnArray<double>,_10> *in_RDI;
  ulong uVar8;
  int64_t i_1;
  TPZEqnArray<double> *newstore;
  int64_t realsize;
  int64_t i;
  TPZEqnArray<double> *in_stack_ffffffffffffff18;
  TPZEqnArray<double> *in_stack_ffffffffffffff20;
  TPZEqnArray<double> *this_01;
  TPZEqnArray<double> *in_stack_ffffffffffffff50;
  TPZEqnArray<double> *local_98;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        if ((in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore !=
            (TPZEqnArray<double> *)&in_RDI->field_0x20) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements;
              local_18 = local_18 + 1) {
            TPZEqnArray<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          }
          pTVar7 = (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore;
          if (pTVar7 != (TPZEqnArray<double> *)0x0) {
            lVar1 = *(long *)&pTVar7[-1].fLastTerm;
            for (pTVar3 = pTVar7 + lVar1; pTVar7 != pTVar3; pTVar3 = pTVar3 + -1) {
              TPZEqnArray<double>::~TPZEqnArray(in_stack_ffffffffffffff20);
            }
            operator_delete__(&pTVar7[-1].fLastTerm,lVar1 * 0x3290 + 8);
          }
          (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore =
               (TPZEqnArray<double> *)&in_RDI->field_0x20;
        }
        (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = 0;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x3290),0);
        uVar8 = uVar5 + 8;
        if (SUB168(auVar2 * ZEXT816(0x3290),8) != 0 || 0xfffffffffffffff7 < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        puVar6 = (ulong *)operator_new__(uVar8);
        *puVar6 = uVar4;
        pTVar7 = (TPZEqnArray<double> *)(puVar6 + 1);
        if (uVar4 != 0) {
          local_98 = pTVar7;
          do {
            TPZEqnArray<double>::TPZEqnArray(in_stack_ffffffffffffff50);
            local_98 = local_98 + 1;
          } while (local_98 != pTVar7 + uVar4);
        }
        for (local_40 = 0; local_40 < (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements;
            local_40 = local_40 + 1) {
          TPZEqnArray<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        if (((in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore !=
             (TPZEqnArray<double> *)&in_RDI->field_0x20) &&
           (pTVar3 = (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore,
           pTVar3 != (TPZEqnArray<double> *)0x0)) {
          lVar1 = *(long *)&pTVar3[-1].fLastTerm;
          this_01 = pTVar3 + lVar1;
          while (pTVar3 != this_01) {
            this_01 = this_01 + -1;
            TPZEqnArray<double>::~TPZEqnArray(this_01);
          }
          operator_delete__(&pTVar3[-1].fLastTerm,lVar1 * 0x3290 + 8);
        }
        (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fStore = pTVar7;
        (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = uVar4;
      }
    }
    else {
      (in_RDI->super_TPZVec<TPZEqnArray<double>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}